

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void deferred_on_shutdown(void *arg,void *arg2)

{
  char *pcVar1;
  fio_defer_task_s task;
  fio_data_s *pfVar2;
  char cVar3;
  int *piVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  fio_lock_i ret;
  
  pfVar2 = fio_data;
  lVar7 = (long)(int)((ulong)arg >> 8) * 0xa8;
  if (*(long *)((long)fio_data + lVar7 + 0x58) == 0) {
    return;
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  LOCK();
  pcVar1 = (char *)((long)pfVar2 + lVar7 + 0x6c);
  cVar3 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  if (cVar3 == '\0') {
    lVar6 = *(long *)((long)fio_data + lVar7 + 0x58);
    if (lVar6 == 0) {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar7 + 0x6c) = 0;
      UNLOCK();
      lVar6 = 0;
      *piVar4 = 9;
      goto LAB_00117704;
    }
    LOCK();
    cVar3 = *(char *)(lVar6 + 0x28);
    *(char *)(lVar6 + 0x28) = '\x01';
    UNLOCK();
    puVar5 = (undefined1 *)((long)fio_data + lVar7 + 0x6c);
    if (cVar3 == '\0') {
      LOCK();
      *puVar5 = 0;
      UNLOCK();
      goto LAB_00117704;
    }
    LOCK();
    *puVar5 = 0;
    UNLOCK();
  }
  *piVar4 = 0xb;
  lVar6 = 0;
LAB_00117704:
  if (lVar6 == 0) {
    if (*piVar4 != 9) {
      task.arg1 = arg;
      task.func = deferred_on_shutdown;
      task.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task,&task_queue_normal);
    }
  }
  else {
    *(__time_t *)((long)fio_data + lVar7 + 0x60) = (fio_data->last_cycle).tv_sec;
    if (*(code **)(lVar6 + 0x10) == (code *)0x0) {
      cVar3 = '\0';
    }
    else {
      cVar3 = (**(code **)(lVar6 + 0x10))(arg,lVar6);
    }
    if (cVar3 == '\0') {
      LOCK();
      fio_data->connection_count = fio_data->connection_count + 1;
      UNLOCK();
      *(undefined1 *)((long)fio_data + lVar7 + 0x6a) = 8;
      *(code **)(lVar6 + 0x20) = mock_ping;
      LOCK();
      *(undefined1 *)(lVar6 + 0x28) = 0;
      UNLOCK();
      fio_close((intptr_t)arg);
      return;
    }
    if (cVar3 == -1) {
      cVar3 = '\0';
    }
    else {
      LOCK();
      fio_data->connection_count = fio_data->connection_count + 1;
      UNLOCK();
    }
    *(char *)((long)fio_data + lVar7 + 0x6a) = cVar3;
    *(code **)(lVar6 + 0x20) = mock_ping2;
    LOCK();
    *(undefined1 *)(lVar6 + 0x28) = 0;
    UNLOCK();
  }
  return;
}

Assistant:

static void deferred_on_shutdown(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF)
      return;
    goto postpone;
  }
  touchfd(fio_uuid2fd(arg));
  uint8_t r = pr->on_shutdown ? pr->on_shutdown((intptr_t)arg, pr) : 0;
  if (r) {
    if (r == 255) {
      uuid_data(arg).timeout = 0;
    } else {
      fio_atomic_add(&fio_data->connection_count, 1);
      uuid_data(arg).timeout = r;
    }
    pr->ping = mock_ping2;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
  } else {
    fio_atomic_add(&fio_data->connection_count, 1);
    uuid_data(arg).timeout = 8;
    pr->ping = mock_ping;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
    fio_close((intptr_t)arg);
  }
  return;
postpone:
  fio_defer_push_task(deferred_on_shutdown, arg, NULL);
  (void)arg2;
}